

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_dir.c
# Opt level: O0

int DIR_stat(void *opaque,char *name,PHYSFS_Stat *stat)

{
  undefined1 *ptr;
  PHYSFS_Stat *pPVar1;
  size_t sVar2;
  size_t sVar3;
  ulong len_00;
  char *buf;
  char *pcVar4;
  undefined1 **ppuVar5;
  undefined1 *local_68;
  size_t local_60;
  char *local_58;
  PHYSFS_Stat *local_50;
  size_t local_48;
  size_t local_40;
  size_t len;
  char *d;
  PHYSFS_Stat *pPStack_28;
  int retval;
  PHYSFS_Stat *stat_local;
  char *name_local;
  void *opaque_local;
  
  ppuVar5 = &local_68;
  d._4_4_ = 0;
  pPStack_28 = stat;
  stat_local = (PHYSFS_Stat *)name;
  name_local = (char *)opaque;
  if (opaque == (void *)0x0) {
    local_48 = 0;
  }
  else {
    local_48 = strlen((char *)opaque);
  }
  local_60 = local_48;
  sVar3 = strlen((char *)stat_local);
  len_00 = local_60 + sVar3 + 1;
  local_58 = name_local;
  local_50 = stat_local;
  if (len_00 < 0x100) {
    ppuVar5 = (undefined1 **)((long)&local_68 - (local_60 + sVar3 + 0x18 & 0xfffffffffffffff0));
    local_68 = (undefined1 *)ppuVar5;
  }
  else {
    local_68 = (undefined1 *)0x0;
  }
  ptr = local_68;
  local_40 = len_00;
  *(undefined8 *)((long)ppuVar5 + -8) = 0x110f16;
  buf = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
  sVar2 = local_40;
  pPVar1 = local_50;
  pcVar4 = local_58;
  *(undefined8 *)((long)ppuVar5 + -8) = 0x110f2a;
  pcVar4 = cvtToDependent(pcVar4,(char *)pPVar1,buf,sVar2);
  pPVar1 = pPStack_28;
  if (pcVar4 == (char *)0x0) {
    opaque_local._4_4_ = 0;
  }
  else {
    len = (size_t)pcVar4;
    *(undefined8 *)((long)ppuVar5 + -8) = 0x110f4d;
    d._4_4_ = __PHYSFS_platformStat(pcVar4,pPVar1);
    sVar2 = len;
    *(undefined8 *)((long)ppuVar5 + -8) = 0x110f59;
    __PHYSFS_smallFree((void *)sVar2);
    opaque_local._4_4_ = d._4_4_;
  }
  return opaque_local._4_4_;
}

Assistant:

static int DIR_stat(void *opaque, const char *name, PHYSFS_Stat *stat)
{
    int retval = 0;
    char *d;

    CVT_TO_DEPENDENT(d, opaque, name);
    BAIL_IF_ERRPASS(!d, 0);
    retval = __PHYSFS_platformStat(d, stat);
    __PHYSFS_smallFree(d);
    return retval;
}